

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encode_options<char>::basic_json_encode_options
          (basic_json_encode_options<char> *this)

{
  undefined8 *in_RDI;
  basic_json_options_common<char> *in_stack_ffffffffffffffe0;
  string *this_00;
  
  basic_json_options_common<char>::basic_json_options_common(in_stack_ffffffffffffffe0);
  *in_RDI = 0x1333830;
  in_RDI[8] = 0x1333858;
  *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) & 0xfe;
  *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) & 0xfd;
  *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) & 0xfb;
  *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) & 0xf7;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 3;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x11) = 1;
  *(undefined1 *)((long)in_RDI + 0x12) = 1;
  *(undefined1 *)((long)in_RDI + 0x13) = 0;
  *(undefined1 *)((long)in_RDI + 0x14) = 4;
  in_RDI[3] = 0x78;
  this_00 = (string *)(in_RDI + 4);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::push_back((char)this_00);
  return;
}

Assistant:

basic_json_encode_options()
        : escape_all_non_ascii_(false),
          escape_solidus_(false),
          pad_inside_object_braces_(false),
          pad_inside_array_brackets_(false),
          float_format_(float_chars_format::general),
          byte_string_format_(byte_string_chars_format::none),
          bignum_format_(bignum_format_kind::raw),
          line_splits_(line_split_kind::multi_line),
          object_object_line_splits_(line_split_kind{}),
          object_array_line_splits_(line_split_kind{}),
          array_array_line_splits_(line_split_kind{}),
          array_object_line_splits_(line_split_kind{}),
          spaces_around_colon_(spaces_option::space_after),
          spaces_around_comma_(spaces_option::space_after)
    {
        new_line_chars_.push_back('\n');
    }